

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

ssize_t __thiscall
just::process::impl::input_file::read_abi_cxx11_
          (input_file *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined4 in_register_00000034;
  undefined1 local_598 [8];
  char buff [1024];
  ostringstream local_190 [8];
  ostringstream s;
  input_file *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  while( true ) {
    bVar1 = eof((input_file *)CONCAT44(in_register_00000034,__fd));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    read((input_file *)CONCAT44(in_register_00000034,__fd),(int)local_598,(void *)0x400,__nbytes);
    std::ostream::write((char *)local_190,(long)local_598);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return (ssize_t)this;
}

Assistant:

std::string read()
        {
          std::ostringstream s;
          static const int buffsize = 1024;
          char buff[buffsize];
          while (!eof())
          {
            s.write(buff, read(buff, buffsize));
          }
          return s.str();
        }